

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_avx2.c
# Opt level: O3

void idct8x8_avx2(__m256i *in,__m256i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined4 uVar1;
  int iVar2;
  __m256i alVar3;
  __m256i alVar4;
  __m256i alVar5;
  __m256i alVar6;
  __m256i alVar7;
  __m256i alVar8;
  __m256i alVar9;
  __m256i alVar10;
  undefined1 auVar11 [32];
  int iVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  __m256i clamp_hi_out;
  __m256i clamp_lo_out;
  int local_80;
  int iStack_7c;
  int iStack_78;
  int iStack_74;
  int iStack_70;
  int iStack_6c;
  int iStack_68;
  int iStack_64;
  int local_60;
  int iStack_5c;
  int iStack_58;
  int iStack_54;
  int iStack_50;
  int iStack_4c;
  int iStack_48;
  int iStack_44;
  
  lVar13 = (long)bit * 0x100;
  iVar12 = *(int *)((long)vert_filter_length_chroma + lVar13 + 0x180);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar13 + 0x240);
  auVar26._4_4_ = uVar1;
  auVar26._0_4_ = uVar1;
  auVar26._8_4_ = uVar1;
  auVar26._12_4_ = uVar1;
  auVar26._16_4_ = uVar1;
  auVar26._20_4_ = uVar1;
  auVar26._24_4_ = uVar1;
  auVar26._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar13 + 0x1c0);
  auVar24._4_4_ = uVar1;
  auVar24._0_4_ = uVar1;
  auVar24._8_4_ = uVar1;
  auVar24._12_4_ = uVar1;
  auVar24._16_4_ = uVar1;
  auVar24._20_4_ = uVar1;
  auVar24._24_4_ = uVar1;
  auVar24._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar13 + 0x1e0);
  auVar19._4_4_ = uVar1;
  auVar19._0_4_ = uVar1;
  auVar19._8_4_ = uVar1;
  auVar19._12_4_ = uVar1;
  auVar19._16_4_ = uVar1;
  auVar19._20_4_ = uVar1;
  auVar19._24_4_ = uVar1;
  auVar19._28_4_ = uVar1;
  iVar16 = *(int *)((long)vert_filter_length_chroma + lVar13 + 0x1a0);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar13 + 0x220);
  auVar21._4_4_ = uVar1;
  auVar21._0_4_ = uVar1;
  auVar21._8_4_ = uVar1;
  auVar21._12_4_ = uVar1;
  auVar21._16_4_ = uVar1;
  auVar21._20_4_ = uVar1;
  auVar21._24_4_ = uVar1;
  auVar21._28_4_ = uVar1;
  iVar2 = *(int *)((long)vert_filter_length_chroma + lVar13 + 0x200);
  iVar17 = -iVar12;
  iVar14 = -iVar2;
  iVar18 = -iVar16;
  iVar15 = 1 << ((char)bit - 1U & 0x1f);
  auVar28._4_4_ = iVar17;
  auVar28._0_4_ = iVar17;
  auVar28._8_4_ = iVar17;
  auVar28._12_4_ = iVar17;
  auVar28._16_4_ = iVar17;
  auVar28._20_4_ = iVar17;
  auVar28._24_4_ = iVar17;
  auVar28._28_4_ = iVar17;
  auVar32._4_4_ = iVar14;
  auVar32._0_4_ = iVar14;
  auVar32._8_4_ = iVar14;
  auVar32._12_4_ = iVar14;
  auVar32._16_4_ = iVar14;
  auVar32._20_4_ = iVar14;
  auVar32._24_4_ = iVar14;
  auVar32._28_4_ = iVar14;
  auVar31._4_4_ = iVar2;
  auVar31._0_4_ = iVar2;
  auVar31._8_4_ = iVar2;
  auVar31._12_4_ = iVar2;
  auVar31._16_4_ = iVar2;
  auVar31._20_4_ = iVar2;
  auVar31._24_4_ = iVar2;
  auVar31._28_4_ = iVar2;
  auVar33._4_4_ = iVar12;
  auVar33._0_4_ = iVar12;
  auVar33._8_4_ = iVar12;
  auVar33._12_4_ = iVar12;
  auVar33._16_4_ = iVar12;
  auVar33._20_4_ = iVar12;
  auVar33._24_4_ = iVar12;
  auVar33._28_4_ = iVar12;
  auVar29._4_4_ = iVar18;
  auVar29._0_4_ = iVar18;
  auVar29._8_4_ = iVar18;
  auVar29._12_4_ = iVar18;
  auVar29._16_4_ = iVar18;
  auVar29._20_4_ = iVar18;
  auVar29._24_4_ = iVar18;
  auVar29._28_4_ = iVar18;
  auVar20._4_4_ = iVar15;
  auVar20._0_4_ = iVar15;
  auVar20._8_4_ = iVar15;
  auVar20._12_4_ = iVar15;
  auVar20._16_4_ = iVar15;
  auVar20._20_4_ = iVar15;
  auVar20._24_4_ = iVar15;
  auVar20._28_4_ = iVar15;
  auVar11 = vpmulld_avx2((undefined1  [32])in[1],auVar26);
  auVar28 = vpmulld_avx2((undefined1  [32])in[7],auVar28);
  auVar11 = vpaddd_avx2(auVar11,auVar20);
  auVar11 = vpaddd_avx2(auVar11,auVar28);
  auVar28 = vpmulld_avx2((undefined1  [32])in[1],auVar33);
  auVar26 = vpmulld_avx2((undefined1  [32])in[7],auVar26);
  auVar28 = vpaddd_avx2(auVar28,auVar20);
  auVar28 = vpaddd_avx2(auVar28,auVar26);
  auVar26 = vpmulld_avx2((undefined1  [32])in[5],auVar24);
  auVar32 = vpmulld_avx2((undefined1  [32])in[3],auVar32);
  auVar26 = vpaddd_avx2(auVar26,auVar20);
  auVar26 = vpaddd_avx2(auVar26,auVar32);
  auVar32 = vpmulld_avx2((undefined1  [32])in[5],auVar31);
  auVar24 = vpmulld_avx2((undefined1  [32])in[3],auVar24);
  auVar32 = vpaddd_avx2(auVar32,auVar20);
  auVar32 = vpaddd_avx2(auVar32,auVar24);
  auVar24 = vpmulld_avx2(auVar19,(undefined1  [32])*in);
  auVar25 = vpmulld_avx2(auVar19,(undefined1  [32])in[4]);
  auVar24 = vpaddd_avx2(auVar24,auVar20);
  auVar31 = vpaddd_avx2(auVar25,auVar24);
  auVar33 = vpsubd_avx2(auVar24,auVar25);
  auVar24 = vpmulld_avx2((undefined1  [32])in[2],auVar21);
  auVar25 = vpmulld_avx2((undefined1  [32])in[6],auVar29);
  auVar24 = vpaddd_avx2(auVar24,auVar20);
  auVar24 = vpaddd_avx2(auVar24,auVar25);
  auVar25._4_4_ = iVar16;
  auVar25._0_4_ = iVar16;
  auVar25._8_4_ = iVar16;
  auVar25._12_4_ = iVar16;
  auVar25._16_4_ = iVar16;
  auVar25._20_4_ = iVar16;
  auVar25._24_4_ = iVar16;
  auVar25._28_4_ = iVar16;
  auVar25 = vpmulld_avx2((undefined1  [32])in[2],auVar25);
  iVar16 = bd + (uint)(do_cols == 0) * 2;
  iVar12 = 0x8000;
  if (0xf < iVar16 + 6) {
    iVar12 = 1 << ((char)iVar16 + 5U & 0x1f);
  }
  iVar16 = -iVar12;
  auVar21 = vpmulld_avx2((undefined1  [32])in[6],auVar21);
  iVar12 = iVar12 + -1;
  auVar29 = vpsrad_avx2(auVar11,ZEXT416((uint)bit));
  auVar30 = vpsrad_avx2(auVar28,ZEXT416((uint)bit));
  auVar23 = ZEXT416((uint)bit);
  auVar28 = vpsrad_avx2(auVar26,auVar23);
  auVar26 = vpsrad_avx2(auVar32,auVar23);
  auVar32 = vpsrad_avx2(auVar31,auVar23);
  auVar31 = vpsrad_avx2(auVar33,auVar23);
  auVar23 = ZEXT416((uint)bit);
  auVar24 = vpsrad_avx2(auVar24,auVar23);
  auVar11 = vpaddd_avx2(auVar25,auVar20);
  auVar11 = vpaddd_avx2(auVar11,auVar21);
  auVar25 = vpsrad_avx2(auVar11,auVar23);
  auVar11 = vpaddd_avx2(auVar28,auVar29);
  auVar33 = vpsubd_avx2(auVar29,auVar28);
  auVar28 = vpaddd_avx2(auVar26,auVar30);
  auVar21 = vpsubd_avx2(auVar30,auVar26);
  auVar26 = vpaddd_avx2(auVar25,auVar32);
  auVar29 = vpsubd_avx2(auVar32,auVar25);
  auVar32 = vpaddd_avx2(auVar31,auVar24);
  auVar30 = vpsubd_avx2(auVar31,auVar24);
  auVar27._4_4_ = iVar16;
  auVar27._0_4_ = iVar16;
  auVar27._8_4_ = iVar16;
  auVar27._12_4_ = iVar16;
  auVar27._16_4_ = iVar16;
  auVar27._20_4_ = iVar16;
  auVar27._24_4_ = iVar16;
  auVar27._28_4_ = iVar16;
  auVar22._4_4_ = iVar12;
  auVar22._0_4_ = iVar12;
  auVar22._8_4_ = iVar12;
  auVar22._12_4_ = iVar12;
  auVar22._16_4_ = iVar12;
  auVar22._20_4_ = iVar12;
  auVar22._24_4_ = iVar12;
  auVar22._28_4_ = iVar12;
  auVar24 = vpmaxsd_avx2(auVar33,auVar27);
  auVar31 = vpminsd_avx2(auVar24,auVar22);
  auVar24 = vpmaxsd_avx2(auVar21,auVar27);
  auVar24 = vpminsd_avx2(auVar24,auVar22);
  auVar31 = vpmulld_avx2(auVar31,auVar19);
  auVar25 = vpmulld_avx2(auVar24,auVar19);
  auVar24 = vpaddd_avx2(auVar31,auVar20);
  auVar31 = vpsubd_avx2(auVar20,auVar31);
  auVar24 = vpaddd_avx2(auVar24,auVar25);
  auVar31 = vpaddd_avx2(auVar31,auVar25);
  auVar11 = vpmaxsd_avx2(auVar11,auVar27);
  auVar25 = vpminsd_avx2(auVar11,auVar22);
  auVar11 = vpmaxsd_avx2(auVar28,auVar27);
  auVar28 = vpminsd_avx2(auVar11,auVar22);
  auVar11 = vpmaxsd_avx2(auVar26,auVar27);
  auVar26 = vpminsd_avx2(auVar11,auVar22);
  auVar11 = vpmaxsd_avx2(auVar29,auVar27);
  auVar33 = vpminsd_avx2(auVar11,auVar22);
  auVar11 = vpmaxsd_avx2(auVar32,auVar27);
  auVar32 = vpminsd_avx2(auVar11,auVar22);
  auVar11 = vpmaxsd_avx2(auVar30,auVar27);
  auVar19 = vpsrad_avx2(auVar24,auVar23);
  auVar24 = vpminsd_avx2(auVar11,auVar22);
  auVar31 = vpsrad_avx2(auVar31,auVar23);
  auVar11 = vpaddd_avx2(auVar26,auVar28);
  auVar20 = vpsubd_avx2(auVar26,auVar28);
  auVar28 = vpaddd_avx2(auVar32,auVar19);
  auVar19 = vpsubd_avx2(auVar32,auVar19);
  auVar26 = vpaddd_avx2(auVar31,auVar24);
  auVar21 = vpsubd_avx2(auVar24,auVar31);
  auVar32 = vpaddd_avx2(auVar33,auVar25);
  auVar33 = vpsubd_avx2(auVar33,auVar25);
  auVar11 = vpmaxsd_avx2(auVar11,auVar27);
  auVar24 = vpmaxsd_avx2(auVar20,auVar27);
  auVar28 = vpmaxsd_avx2(auVar28,auVar27);
  auVar31 = vpmaxsd_avx2(auVar19,auVar27);
  auVar26 = vpmaxsd_avx2(auVar26,auVar27);
  auVar25 = vpmaxsd_avx2(auVar21,auVar27);
  auVar32 = vpmaxsd_avx2(auVar32,auVar27);
  auVar33 = vpmaxsd_avx2(auVar33,auVar27);
  alVar3 = (__m256i)vpminsd_avx2(auVar11,auVar22);
  alVar4 = (__m256i)vpminsd_avx2(auVar24,auVar22);
  alVar5 = (__m256i)vpminsd_avx2(auVar28,auVar22);
  alVar6 = (__m256i)vpminsd_avx2(auVar31,auVar22);
  alVar7 = (__m256i)vpminsd_avx2(auVar26,auVar22);
  alVar8 = (__m256i)vpminsd_avx2(auVar25,auVar22);
  alVar9 = (__m256i)vpminsd_avx2(auVar32,auVar22);
  alVar10 = (__m256i)vpminsd_avx2(auVar33,auVar22);
  *out = alVar3;
  out[7] = alVar4;
  out[1] = alVar5;
  out[6] = alVar6;
  out[2] = alVar7;
  out[5] = alVar8;
  out[3] = alVar9;
  out[4] = alVar10;
  if (do_cols == 0) {
    iVar12 = 10;
    if (10 < bd) {
      iVar12 = bd;
    }
    local_80 = 0x20 << ((byte)iVar12 & 0x1f);
    local_60 = -local_80;
    local_80 = local_80 + -1;
    if (out_shift != 0) {
      iVar12 = 1 << ((char)out_shift - 1U & 0x1f);
      auVar30._4_4_ = iVar12;
      auVar30._0_4_ = iVar12;
      auVar30._8_4_ = iVar12;
      auVar30._12_4_ = iVar12;
      auVar30._16_4_ = iVar12;
      auVar30._20_4_ = iVar12;
      auVar30._24_4_ = iVar12;
      auVar30._28_4_ = iVar12;
      auVar11 = vpaddd_avx2(auVar30,(undefined1  [32])alVar3);
      auVar28 = vpaddd_avx2(auVar30,(undefined1  [32])alVar5);
      auVar26 = vpaddd_avx2(auVar30,(undefined1  [32])alVar7);
      auVar32 = vpaddd_avx2(auVar30,(undefined1  [32])alVar9);
      alVar3 = (__m256i)vpsrad_avx2(auVar11,ZEXT416((uint)out_shift));
      alVar5 = (__m256i)vpsrad_avx2(auVar28,ZEXT416((uint)out_shift));
      *out = alVar3;
      out[1] = alVar5;
      auVar23 = ZEXT416((uint)out_shift);
      alVar3 = (__m256i)vpsrad_avx2(auVar26,auVar23);
      out[2] = alVar3;
      alVar3 = (__m256i)vpsrad_avx2(auVar32,auVar23);
      out[3] = alVar3;
      auVar11 = vpaddd_avx2(auVar30,(undefined1  [32])alVar10);
      auVar28 = vpaddd_avx2(auVar30,(undefined1  [32])alVar8);
      auVar26 = vpaddd_avx2(auVar30,(undefined1  [32])alVar6);
      auVar32 = vpaddd_avx2(auVar30,(undefined1  [32])alVar4);
      alVar3 = (__m256i)vpsrad_avx2(auVar11,auVar23);
      alVar4 = (__m256i)vpsrad_avx2(auVar28,auVar23);
      out[4] = alVar3;
      out[5] = alVar4;
      alVar3 = (__m256i)vpsrad_avx2(auVar26,ZEXT416((uint)out_shift));
      out[6] = alVar3;
      alVar3 = (__m256i)vpsrad_avx2(auVar32,ZEXT416((uint)out_shift));
      out[7] = alVar3;
    }
    iStack_7c = local_80;
    iStack_78 = local_80;
    iStack_74 = local_80;
    iStack_70 = local_80;
    iStack_6c = local_80;
    iStack_68 = local_80;
    iStack_64 = local_80;
    iStack_5c = local_60;
    iStack_58 = local_60;
    iStack_54 = local_60;
    iStack_50 = local_60;
    iStack_4c = local_60;
    iStack_48 = local_60;
    iStack_44 = local_60;
    highbd_clamp_epi32_avx2(out,out,(__m256i *)&local_60,(__m256i *)&local_80,8);
  }
  return;
}

Assistant:

static void idct8x8_avx2(__m256i *in, __m256i *out, int bit, int do_cols,
                         int bd, int out_shift) {
  const int32_t *cospi = cospi_arr(bit);
  const __m256i cospi56 = _mm256_set1_epi32(cospi[56]);
  const __m256i cospim8 = _mm256_set1_epi32(-cospi[8]);
  const __m256i cospi24 = _mm256_set1_epi32(cospi[24]);
  const __m256i cospim40 = _mm256_set1_epi32(-cospi[40]);
  const __m256i cospi40 = _mm256_set1_epi32(cospi[40]);
  const __m256i cospi8 = _mm256_set1_epi32(cospi[8]);
  const __m256i cospi32 = _mm256_set1_epi32(cospi[32]);
  const __m256i cospi48 = _mm256_set1_epi32(cospi[48]);
  const __m256i cospim16 = _mm256_set1_epi32(-cospi[16]);
  const __m256i cospi16 = _mm256_set1_epi32(cospi[16]);
  const __m256i rnding = _mm256_set1_epi32(1 << (bit - 1));
  const int log_range = AOMMAX(16, bd + (do_cols ? 6 : 8));
  const __m256i clamp_lo = _mm256_set1_epi32(-(1 << (log_range - 1)));
  const __m256i clamp_hi = _mm256_set1_epi32((1 << (log_range - 1)) - 1);
  __m256i u0, u1, u2, u3, u4, u5, u6, u7;
  __m256i v0, v1, v2, v3, v4, v5, v6, v7;
  __m256i x, y;

  // stage 0
  // stage 1
  // stage 2
  u0 = in[0];
  u1 = in[4];
  u2 = in[2];
  u3 = in[6];

  x = _mm256_mullo_epi32(in[1], cospi56);
  y = _mm256_mullo_epi32(in[7], cospim8);
  u4 = _mm256_add_epi32(x, y);
  u4 = _mm256_add_epi32(u4, rnding);
  u4 = _mm256_srai_epi32(u4, bit);

  x = _mm256_mullo_epi32(in[1], cospi8);
  y = _mm256_mullo_epi32(in[7], cospi56);
  u7 = _mm256_add_epi32(x, y);
  u7 = _mm256_add_epi32(u7, rnding);
  u7 = _mm256_srai_epi32(u7, bit);

  x = _mm256_mullo_epi32(in[5], cospi24);
  y = _mm256_mullo_epi32(in[3], cospim40);
  u5 = _mm256_add_epi32(x, y);
  u5 = _mm256_add_epi32(u5, rnding);
  u5 = _mm256_srai_epi32(u5, bit);

  x = _mm256_mullo_epi32(in[5], cospi40);
  y = _mm256_mullo_epi32(in[3], cospi24);
  u6 = _mm256_add_epi32(x, y);
  u6 = _mm256_add_epi32(u6, rnding);
  u6 = _mm256_srai_epi32(u6, bit);

  // stage 3
  x = _mm256_mullo_epi32(u0, cospi32);
  y = _mm256_mullo_epi32(u1, cospi32);
  v0 = _mm256_add_epi32(x, y);
  v0 = _mm256_add_epi32(v0, rnding);
  v0 = _mm256_srai_epi32(v0, bit);

  v1 = _mm256_sub_epi32(x, y);
  v1 = _mm256_add_epi32(v1, rnding);
  v1 = _mm256_srai_epi32(v1, bit);

  x = _mm256_mullo_epi32(u2, cospi48);
  y = _mm256_mullo_epi32(u3, cospim16);
  v2 = _mm256_add_epi32(x, y);
  v2 = _mm256_add_epi32(v2, rnding);
  v2 = _mm256_srai_epi32(v2, bit);

  x = _mm256_mullo_epi32(u2, cospi16);
  y = _mm256_mullo_epi32(u3, cospi48);
  v3 = _mm256_add_epi32(x, y);
  v3 = _mm256_add_epi32(v3, rnding);
  v3 = _mm256_srai_epi32(v3, bit);

  addsub_avx2(u4, u5, &v4, &v5, &clamp_lo, &clamp_hi);
  addsub_avx2(u7, u6, &v7, &v6, &clamp_lo, &clamp_hi);

  // stage 4
  addsub_avx2(v0, v3, &u0, &u3, &clamp_lo, &clamp_hi);
  addsub_avx2(v1, v2, &u1, &u2, &clamp_lo, &clamp_hi);
  u4 = v4;
  u7 = v7;

  x = _mm256_mullo_epi32(v5, cospi32);
  y = _mm256_mullo_epi32(v6, cospi32);
  u6 = _mm256_add_epi32(y, x);
  u6 = _mm256_add_epi32(u6, rnding);
  u6 = _mm256_srai_epi32(u6, bit);

  u5 = _mm256_sub_epi32(y, x);
  u5 = _mm256_add_epi32(u5, rnding);
  u5 = _mm256_srai_epi32(u5, bit);

  addsub_avx2(u0, u7, out + 0, out + 7, &clamp_lo, &clamp_hi);
  addsub_avx2(u1, u6, out + 1, out + 6, &clamp_lo, &clamp_hi);
  addsub_avx2(u2, u5, out + 2, out + 5, &clamp_lo, &clamp_hi);
  addsub_avx2(u3, u4, out + 3, out + 4, &clamp_lo, &clamp_hi);
  // stage 5
  if (!do_cols) {
    const int log_range_out = AOMMAX(16, bd + 6);
    const __m256i clamp_lo_out = _mm256_set1_epi32(-(1 << (log_range_out - 1)));
    const __m256i clamp_hi_out =
        _mm256_set1_epi32((1 << (log_range_out - 1)) - 1);

    round_shift_4x4_avx2(out, out_shift);
    round_shift_4x4_avx2(out + 4, out_shift);
    highbd_clamp_epi32_avx2(out, out, &clamp_lo_out, &clamp_hi_out, 8);
  }
}